

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget_p.h
# Opt level: O0

void __thiscall QListWidgetPrivate::QListWidgetPrivate(QListWidgetPrivate *this)

{
  QListViewPrivate *in_RDI;
  array<QMetaObject::Connection,_8UL> *unaff_retaddr;
  
  QListViewPrivate::QListViewPrivate(in_RDI);
  *(undefined ***)
   &(in_RDI->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QListWidgetPrivate_00d2f880;
  *(undefined4 *)&in_RDI->field_0x5bc = 0;
  in_RDI[1].super_QAbstractItemViewPrivate.super_QAbstractScrollAreaPrivate.super_QFramePrivate.
  super_QWidgetPrivate.super_QObjectPrivate = (QObjectPrivate)0x0;
  std::optional<QFlags<Qt::DropAction>_>::optional((optional<QFlags<Qt::DropAction>_> *)0x8a23bc);
  std::array<QMetaObject::Connection,_8UL>::array(unaff_retaddr);
  std::array<QMetaObject::Connection,_2UL>::array
            ((array<QMetaObject::Connection,_2UL> *)unaff_retaddr);
  return;
}

Assistant:

QListWidgetPrivate() : QListViewPrivate(), sortOrder(Qt::AscendingOrder), sortingEnabled(false) {}